

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

size_t skip_line_splice(Source_File *src)

{
  size_t sVar1;
  ulong uVar2;
  
  uVar2 = src->where_in_src;
  sVar1 = 0;
  while (((uVar2 < src->src_size - 1 && (src->src[uVar2] == '\\')) && (src->src[uVar2 + 1] == '\n'))
        ) {
    uVar2 = uVar2 + 2;
    src->where_in_src = uVar2;
    sVar1 = sVar1 + 2;
  }
  return sVar1;
}

Assistant:

size_t skip_line_splice(struct Source_File *src)
{
	size_t current_size=0;
	while(src->where_in_src<src->src_size-1 && src->src[src->where_in_src]=='\\' && src->src[src->where_in_src+1]=='\n')
	{
		src->where_in_src+=2;
		current_size+=2;
	}
	return current_size;
}